

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CColorConverter.cpp
# Opt level: O0

void irr::video::CColorConverter::convert16bitToA8R8G8B8andResize
               (s16 *in,s32 *out,s32 newWidth,s32 newHeight,s32 currentWidth,s32 currentHeight)

{
  uint uVar1;
  s32 y;
  s32 x;
  s32 t;
  f32 sy;
  f32 sourceYStep;
  f32 sourceXStep;
  s32 currentHeight_local;
  s32 currentWidth_local;
  s32 newHeight_local;
  s32 newWidth_local;
  s32 *out_local;
  s16 *in_local;
  
  if ((newWidth != 0) && (newHeight != 0)) {
    for (x = 0; x < newWidth; x = x + 1) {
      sy = 0.0;
      for (y = 0; y < newHeight; y = y + 1) {
        uVar1 = (uint)in[(int)((float)x * ((float)currentWidth / (float)newWidth) +
                              (float)((int)(float)sy * currentWidth))];
        out[y * newWidth + x] =
             ((int)uVar1 >> 0xf) << 0x1f | ((int)uVar1 >> 10 & 0x1fU) << 0x13 |
             ((int)uVar1 >> 5 & 0x1fU) << 0xb | (uVar1 & 0x1f) << 3;
        sy = (f32)((float)currentHeight / (float)newHeight + (float)sy);
      }
    }
  }
  return;
}

Assistant:

void CColorConverter::convert16bitToA8R8G8B8andResize(const s16 *in, s32 *out, s32 newWidth, s32 newHeight, s32 currentWidth, s32 currentHeight)
{
	if (!newWidth || !newHeight)
		return;

	// note: this is very very slow. (i didn't want to write a fast version.
	// but hopefully, nobody wants to convert surfaces every frame.

	f32 sourceXStep = (f32)currentWidth / (f32)newWidth;
	f32 sourceYStep = (f32)currentHeight / (f32)newHeight;
	f32 sy;
	s32 t;

	for (s32 x = 0; x < newWidth; ++x) {
		sy = 0.0f;

		for (s32 y = 0; y < newHeight; ++y) {
			t = in[(s32)(((s32)sy) * currentWidth + x * sourceXStep)];
			t = (((t >> 15) & 0x1) << 31) | (((t >> 10) & 0x1F) << 19) |
				(((t >> 5) & 0x1F) << 11) | (t & 0x1F) << 3;
			out[(s32)(y * newWidth + x)] = t;

			sy += sourceYStep;
		}
	}
}